

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_parse.cc
# Opt level: O0

int absl::(anonymous_namespace)::ConsumeDigits<16,unsigned_long>
              (char *begin,char *end,int max_digits,unsigned_long *out,bool *dropped_nonzero_digit)

{
  bool bVar1;
  uint uVar2;
  ulong *in_RCX;
  int in_EDX;
  char *in_RSI;
  char *in_RDI;
  undefined1 *in_R8;
  bool bVar3;
  bool dropped_nonzero;
  unsigned_long digit;
  char *significant_digits_end;
  unsigned_long accumulator;
  char *original_begin;
  bool local_5a;
  bool local_59;
  char *local_58;
  ulong local_38;
  char *local_8;
  
  local_8 = in_RDI;
  if (0x40 < in_EDX * 4) {
    __assert_fail("max_digits * 4 <= std::numeric_limits<T>::digits",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/internal/charconv_parse.cc"
                  ,0xfe,
                  "int absl::(anonymous namespace)::ConsumeDigits(const char *, const char *, int, T *, bool *) [base = 16, T = unsigned long]"
                 );
  }
  while( true ) {
    bVar3 = false;
    if ((*in_RCX == 0) && (bVar3 = false, in_RSI != local_8)) {
      bVar3 = *local_8 == '0';
    }
    if (!bVar3) break;
    local_8 = local_8 + 1;
  }
  local_38 = *in_RCX;
  local_58 = in_RSI;
  if ((long)in_EDX < (long)in_RSI - (long)local_8) {
    local_58 = local_8 + in_EDX;
  }
  while( true ) {
    local_59 = false;
    if (local_8 < local_58) {
      local_59 = anon_unknown_0::IsDigit<16>(*local_8);
    }
    if (local_59 == false) {
      bVar3 = false;
      while( true ) {
        local_5a = false;
        if (local_8 < in_RSI) {
          local_5a = anon_unknown_0::IsDigit<16>(*local_8);
        }
        if (local_5a == false) break;
        bVar1 = !bVar3;
        bVar3 = true;
        if (bVar1) {
          bVar3 = *local_8 != '0';
        }
        local_8 = local_8 + 1;
      }
      if ((bVar3) && (in_R8 != (undefined1 *)0x0)) {
        *in_R8 = 1;
      }
      *in_RCX = local_38;
      return (int)local_8 - (int)in_RDI;
    }
    uVar2 = anon_unknown_0::ToDigit<16>(*local_8);
    if (local_38 << 4 < local_38) {
      __assert_fail("accumulator * base >= accumulator",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/internal/charconv_parse.cc"
                    ,0x10e,
                    "int absl::(anonymous namespace)::ConsumeDigits(const char *, const char *, int, T *, bool *) [base = 16, T = unsigned long]"
                   );
    }
    local_38 = local_38 * 0x10;
    if (local_38 + uVar2 < local_38) break;
    local_38 = uVar2 + local_38;
    local_8 = local_8 + 1;
  }
  __assert_fail("accumulator + digit >= accumulator",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/internal/charconv_parse.cc"
                ,0x110,
                "int absl::(anonymous namespace)::ConsumeDigits(const char *, const char *, int, T *, bool *) [base = 16, T = unsigned long]"
               );
}

Assistant:

int ConsumeDigits(const char* begin, const char* end, int max_digits, T* out,
                  bool* dropped_nonzero_digit) {
  if (base == 10) {
    assert(max_digits <= std::numeric_limits<T>::digits10);
  } else if (base == 16) {
    assert(max_digits * 4 <= std::numeric_limits<T>::digits);
  }
  const char* const original_begin = begin;

  // Skip leading zeros, but only if *out is zero.
  // They don't cause an overflow so we don't have to count them for
  // `max_digits`.
  while (!*out && end != begin && *begin == '0') ++begin;

  T accumulator = *out;
  const char* significant_digits_end =
      (end - begin > max_digits) ? begin + max_digits : end;
  while (begin < significant_digits_end && IsDigit<base>(*begin)) {
    // Do not guard against *out overflow; max_digits was chosen to avoid this.
    // Do assert against it, to detect problems in debug builds.
    auto digit = static_cast<T>(ToDigit<base>(*begin));
    assert(accumulator * base >= accumulator);
    accumulator *= base;
    assert(accumulator + digit >= accumulator);
    accumulator += digit;
    ++begin;
  }
  bool dropped_nonzero = false;
  while (begin < end && IsDigit<base>(*begin)) {
    dropped_nonzero = dropped_nonzero || (*begin != '0');
    ++begin;
  }
  if (dropped_nonzero && dropped_nonzero_digit != nullptr) {
    *dropped_nonzero_digit = true;
  }
  *out = accumulator;
  return static_cast<int>(begin - original_begin);
}